

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O3

void __thiscall
asmjit::_abi_1_10::x86::X86BufferWriter::emitImmediate
          (X86BufferWriter *this,uint64_t immValue,FastUInt8 immSize)

{
  uint8_t *puVar1;
  uint64_t imm;
  
  if (3 < immSize) {
    *(int *)(this->super_CodeWriter)._cursor = (int)immValue;
    (this->super_CodeWriter)._cursor = (this->super_CodeWriter)._cursor + 4;
    immValue = immValue >> 0x20;
    immSize = immSize + 0xfc;
  }
  if (immSize != '\0') {
    *(this->super_CodeWriter)._cursor = (uint8_t)immValue;
    puVar1 = (this->super_CodeWriter)._cursor + 1;
    (this->super_CodeWriter)._cursor = puVar1;
    if (immSize != '\x01') {
      *puVar1 = (uint8_t)(immValue >> 8);
      puVar1 = (this->super_CodeWriter)._cursor + 1;
      (this->super_CodeWriter)._cursor = puVar1;
      if (immSize != '\x02') {
        *puVar1 = (uint8_t)(immValue >> 0x10);
        puVar1 = (this->super_CodeWriter)._cursor + 1;
        (this->super_CodeWriter)._cursor = puVar1;
        if (immSize != '\x03') {
          *puVar1 = (uint8_t)(immValue >> 0x18);
          (this->super_CodeWriter)._cursor = (this->super_CodeWriter)._cursor + 1;
        }
      }
    }
  }
  return;
}

Assistant:

ASMJIT_FORCE_INLINE void emitImmediate(uint64_t immValue, FastUInt8 immSize) noexcept {
#if ASMJIT_ARCH_BITS >= 64
    uint64_t imm = immValue;
    if (immSize >= 4) {
      emit32uLE(imm & 0xFFFFFFFFu);
      imm >>= 32;
      immSize = FastUInt8(immSize - 4u);
    }
#else
    uint32_t imm = uint32_t(immValue & 0xFFFFFFFFu);
    if (immSize >= 4) {
      emit32uLE(imm);
      imm = uint32_t(immValue >> 32);
      immSize = FastUInt8(immSize - 4u);
    }
#endif

    if (!immSize)
      return;
    emit8(imm & 0xFFu);
    imm >>= 8;

    if (--immSize == 0)
      return;
    emit8(imm & 0xFFu);
    imm >>= 8;

    if (--immSize == 0)
      return;
    emit8(imm & 0xFFu);
    imm >>= 8;

    if (--immSize == 0)
      return;
    emit8(imm & 0xFFu);
  }